

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O0

bool tinyusdz::tydra::DirectBindingStrongerThanDescendants(Stage *_stage,Prim *prim,string *purpose)

{
  bool bVar1;
  function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)> local_50;
  anon_class_8_1_76362ffe aStack_28;
  bool ret;
  anon_class_8_1_76362ffe apply_fun;
  string *purpose_local;
  Prim *prim_local;
  Stage *_stage_local;
  
  aStack_28.purpose = purpose;
  apply_fun.purpose = purpose;
  ::std::function<bool(tinyusdz::Stage_const&,tinyusdz::MaterialBinding_const*)>::
  function<tinyusdz::tydra::DirectBindingStrongerThanDescendants(tinyusdz::Stage_const&,tinyusdz::Prim_const&,std::__cxx11::string_const&)::__0&,void>
            ((function<bool(tinyusdz::Stage_const&,tinyusdz::MaterialBinding_const*)> *)&local_50,
             &stack0xffffffffffffffd8);
  bVar1 = ApplyToMaterialBinding(_stage,prim,&local_50);
  ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)>::~function
            (&local_50);
  return bVar1;
}

Assistant:

bool DirectBindingStrongerThanDescendants(
  const Stage &_stage,
  const Prim &prim,
  const std::string &purpose)
{
  auto apply_fun = [&](const Stage &stage, const MaterialBinding *mb) -> bool {

    (void)stage;

    Relationship mat_rel;
    if (!mb->get_materialBinding(value::token(purpose), &mat_rel)) {
      return false;
    }

    const value::token strength = mat_rel.metas().bindMaterialAs.value_or(kWeaderThanDescendants);
    return strength.str() == kStrongerThanDescendants;

  };

  bool ret = ApplyToMaterialBinding(_stage, prim, apply_fun);

  return ret;
}